

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_api.hpp
# Opt level: O0

void __thiscall
hrgls::API::API(API *this,string *user,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *credentials)

{
  undefined8 uVar1;
  mapped_type mVar2;
  API_private *pAVar3;
  mapped_type *pmVar4;
  undefined8 uVar5;
  uchar *puVar6;
  size_type sVar7;
  key_type local_80;
  key_type local_78;
  key_type local_70;
  key_type local_68;
  key_type local_60;
  key_type local_58;
  key_type local_50;
  key_type local_48;
  key_type local_40;
  undefined8 local_38;
  hrgls_APICreateParams params;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_20;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *credentials_local;
  string *user_local;
  API *this_local;
  
  this->m_private = (API_private *)0x0;
  local_20 = credentials;
  credentials_local = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)user;
  user_local = (string *)this;
  pAVar3 = (API_private *)operator_new(0x70);
  memset(pAVar3,0,0x70);
  API_private::API_private(pAVar3);
  this->m_private = pAVar3;
  mVar2 = hrgls_APICreateParametersCreate(&local_38);
  pAVar3 = this->m_private;
  local_40._M_thread = (native_handle_type)std::this_thread::get_id();
  pmVar4 = std::
           map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
           ::operator[](&pAVar3->m_status,&local_40);
  *pmVar4 = mVar2;
  pAVar3 = this->m_private;
  local_48._M_thread = (native_handle_type)std::this_thread::get_id();
  pmVar4 = std::
           map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
           ::operator[](&pAVar3->m_status,&local_48);
  uVar1 = local_38;
  if (*pmVar4 == 0) {
    uVar5 = std::__cxx11::string::c_str();
    mVar2 = hrgls_APICreateParametersSetName(uVar1,uVar5);
    pAVar3 = this->m_private;
    local_50._M_thread = (native_handle_type)std::this_thread::get_id();
    pmVar4 = std::
             map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
             ::operator[](&pAVar3->m_status,&local_50);
    *pmVar4 = mVar2;
    pAVar3 = this->m_private;
    local_58._M_thread = (native_handle_type)std::this_thread::get_id();
    pmVar4 = std::
             map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
             ::operator[](&pAVar3->m_status,&local_58);
    uVar1 = local_38;
    if (*pmVar4 == 0) {
      puVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(credentials);
      sVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(credentials);
      mVar2 = hrgls_APICreateParametersSetCredentials(uVar1,puVar6,sVar7 & 0xffffffff);
      pAVar3 = this->m_private;
      local_60._M_thread = (native_handle_type)std::this_thread::get_id();
      pmVar4 = std::
               map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
               ::operator[](&pAVar3->m_status,&local_60);
      *pmVar4 = mVar2;
      pAVar3 = this->m_private;
      local_68._M_thread = (native_handle_type)std::this_thread::get_id();
      pmVar4 = std::
               map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
               ::operator[](&pAVar3->m_status,&local_68);
      if (*pmVar4 == 0) {
        mVar2 = hrgls_APICreate(this->m_private,local_38);
        pAVar3 = this->m_private;
        local_70._M_thread = (native_handle_type)std::this_thread::get_id();
        pmVar4 = std::
                 map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
                 ::operator[](&pAVar3->m_status,&local_70);
        *pmVar4 = mVar2;
        pAVar3 = this->m_private;
        local_78._M_thread = (native_handle_type)std::this_thread::get_id();
        pmVar4 = std::
                 map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
                 ::operator[](&pAVar3->m_status,&local_78);
        if (*pmVar4 == 0) {
          mVar2 = hrgls_APICreateParametersDestroy(local_38);
          pAVar3 = this->m_private;
          local_80._M_thread = (native_handle_type)std::this_thread::get_id();
          pmVar4 = std::
                   map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
                   ::operator[](&pAVar3->m_status,&local_80);
          *pmVar4 = mVar2;
        }
        else {
          hrgls_APICreateParametersDestroy(local_38);
          this->m_private->m_api = (hrgls_API)0x0;
        }
      }
    }
  }
  return;
}

Assistant:

API::API(
    ::std::string user,
    ::std::vector<uint8_t> credentials)
  {
    // Create the private api pointer we're going to use.  Check for
    // exception when creating it, to avoid passing it up to the caller.
    try {
      m_private = new API_private();
    } catch (...) {
      m_private = nullptr;
      return;
    }

    // Create and fill in the parameters to the API creation routine
    hrgls_APICreateParams params;
    m_private->m_status[std::this_thread::get_id()] = hrgls_APICreateParametersCreate(&params);
    if (m_private->m_status[std::this_thread::get_id()] != hrgls_STATUS_OKAY) {
      return;
    }
    m_private->m_status[std::this_thread::get_id()] = hrgls_APICreateParametersSetName(params, user.c_str());
    if (m_private->m_status[std::this_thread::get_id()] != hrgls_STATUS_OKAY) {
      return;
    }
    m_private->m_status[std::this_thread::get_id()] = hrgls_APICreateParametersSetCredentials(params,
      credentials.data(), static_cast<uint32_t>(credentials.size()));
    if (m_private->m_status[std::this_thread::get_id()] != hrgls_STATUS_OKAY) {
      return;
    }

    // Create the API object we're going to use.
    m_private->m_status[std::this_thread::get_id()] = hrgls_APICreate(&m_private->m_api, params);
    if (m_private->m_status[std::this_thread::get_id()] != hrgls_STATUS_OKAY) {
      hrgls_APICreateParametersDestroy(params);
      m_private->m_api = nullptr;
      return;
    }

    // Destroy the parameter object we created above.
    m_private->m_status[std::this_thread::get_id()] = hrgls_APICreateParametersDestroy(params);
  }